

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_subi_i32_s390x(TCGContext_conflict12 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  TCGv_i32 arg2_00;
  uintptr_t o;
  
  if (arg2 != 0) {
    arg2_00 = tcg_const_i32_s390x(tcg_ctx,arg2);
    tcg_gen_sub_i32(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
    return;
  }
  tcg_gen_mov_i32(tcg_ctx,ret,arg1);
  return;
}

Assistant:

void tcg_gen_subi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_sub_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}